

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdCreateKeyPair(void *handle,bool is_compressed,int network_type,char **pubkey,char **privkey,
                    char **wif)

{
  NetType net_type;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  CfdException *this;
  bool is_bitcoin;
  KeyApi api;
  char *work_wif;
  char *work_privkey;
  string privkey_wif;
  Pubkey pubkey_obj;
  Privkey key;
  bool local_ca;
  KeyApi local_c9;
  char *local_c8;
  char *local_c0;
  void *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  Pubkey local_68;
  Privkey local_50;
  
  local_b0 = 0;
  local_c0 = (char *)0x0;
  local_c8 = (char *)0x0;
  local_b8 = handle;
  cfd::Initialize();
  local_ca = true;
  net_type = cfd::capi::ConvertNetType(network_type,&local_ca);
  if (local_ca != false) {
    cfd::core::Pubkey::Pubkey(&local_68);
    local_a8._0_8_ = &local_98;
    local_a8._8_8_ = 0;
    local_98._M_allocated_capacity = local_98._M_allocated_capacity & 0xffffffffffffff00;
    cfd::api::KeyApi::CreateKeyPair
              (&local_50,&local_c9,is_compressed,&local_68,(string *)local_a8,net_type);
    if (wif == (char **)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = cfd::capi::CreateString((string *)local_a8);
      local_c8 = pcVar1;
    }
    if (privkey == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_88,&local_50);
      pcVar2 = cfd::capi::CreateString(&local_88);
      local_c0 = pcVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    if (pubkey == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::Pubkey::GetHex_abi_cxx11_(&local_88,&local_68);
      pcVar3 = cfd::capi::CreateString(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    if (pcVar2 != (char *)0x0) {
      *privkey = pcVar2;
    }
    if (pcVar1 != (char *)0x0) {
      *wif = pcVar1;
    }
    if (pcVar3 != (char *)0x0) {
      *pubkey = pcVar3;
    }
    if (local_50.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != &local_98) {
      operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
    }
    if (local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_a8._0_8_ = "cfdcapi_key.cpp";
  local_a8._8_4_ = 0x3f3;
  local_98._M_allocated_capacity = 0x620200;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,"privkey\'s network_type is invalid."
            );
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_a8._0_8_ = &local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"Failed to parameter. privkey\'s network_type is invalid.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_a8);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateKeyPair(
    void* handle, bool is_compressed, int network_type, char** pubkey,
    char** privkey, char** wif) {
  char* work_pubkey = nullptr;
  char* work_privkey = nullptr;
  char* work_wif = nullptr;
  try {
    cfd::Initialize();

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }

    KeyApi api;
    Pubkey pubkey_obj;
    std::string privkey_wif;
    Privkey key =
        api.CreateKeyPair(is_compressed, &pubkey_obj, &privkey_wif, net_type);

    if (wif != nullptr) {
      work_wif = CreateString(privkey_wif);
    }
    if (privkey != nullptr) {
      work_privkey = CreateString(key.GetHex());
    }
    if (pubkey != nullptr) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    }

    if (work_privkey != nullptr) *privkey = work_privkey;
    if (work_wif != nullptr) *wif = work_wif;
    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_privkey, &work_wif, &work_pubkey);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_privkey, &work_wif, &work_pubkey);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_privkey, &work_wif, &work_pubkey);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}